

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O2

ByteArray<1UL> __thiscall
supermap::io::DeserializeHelper<supermap::ByteArray<1UL>,_void>::deserialize
          (DeserializeHelper<supermap::ByteArray<1UL>,_void> *this,istream *is)

{
  IOException *this_00;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ByteArray<1UL>::ByteArray((ByteArray<1UL> *)this);
  std::istream::read((char *)is,*(long *)this);
  if (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    return (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a0,1);
  std::operator+(&local_80,"Unsuccessful deserialization, expected to read ",&local_a0);
  std::operator+(&local_60,&local_80," bytes, but read only ");
  std::__cxx11::to_string(&local_c0,*(long *)(is + 8));
  std::operator+(&local_40,&local_60,&local_c0);
  supermap::IOException::IOException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static ByteArray<Len> deserialize(std::istream &is) {
        ByteArray<Len> ar;
        is.read(ar.getCharsPointer(), Len);
        if (!is.good()) {
            throw IOException(
                "Unsuccessful deserialization, expected to read " + std::to_string(Len) +
                    " bytes, but read only " + std::to_string(is.gcount()));
        }
        return ar;
    }